

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError parse_ech(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  int iVar1;
  uint uVar2;
  ParameterError PVar3;
  size_t sVar4;
  FILE *__stream;
  char *pcVar5;
  char **str;
  char *tmpcfg;
  char *local_30;
  
  if (!feature_ech) {
    return PARAM_LIBCURL_DOESNT_SUPPORT;
  }
  sVar4 = strlen(nextarg);
  if ((sVar4 < 5) || (iVar1 = curl_strnequal("pn:",nextarg,3), iVar1 == 0)) {
    sVar4 = strlen(nextarg);
    if ((sVar4 < 6) || (iVar1 = curl_strnequal("ecl:",nextarg,4), iVar1 == 0)) {
      str = &config->ech;
    }
    else {
      if (nextarg[4] == '@') {
        local_30 = (char *)0x0;
        uVar2 = (byte)nextarg[5] - 0x2d;
        if (uVar2 == 0) {
          uVar2 = (uint)(byte)nextarg[6];
        }
        __stream = _stdin;
        if (uVar2 != 0) {
          __stream = fopen64(nextarg + 5,"r");
        }
        if (__stream != (FILE *)0x0) {
          PVar3 = file2string(&local_30,(FILE *)__stream);
          if (__stream != _stdin) {
            fclose(__stream);
          }
          if (PVar3 != PARAM_OK) {
            return PVar3;
          }
          pcVar5 = (char *)curl_maprintf("ecl:%s",local_30);
          config->ech_config = pcVar5;
          free(local_30);
          if (config->ech_config == (char *)0x0) {
            return PARAM_NO_MEM;
          }
          return PARAM_OK;
        }
        warnf(global,"Couldn\'t read file \"%s\" specified for \"--ech ecl:\" option",nextarg + 5);
        return PARAM_BAD_USE;
      }
      str = &config->ech_config;
    }
  }
  else {
    str = &config->ech_public;
  }
  PVar3 = getstr(str,nextarg,false);
  return PVar3;
}

Assistant:

static ParameterError parse_ech(struct GlobalConfig *global,
                                struct OperationConfig *config,
                                const char *nextarg)
{
  ParameterError err = PARAM_OK;
  if(!feature_ech)
    err = PARAM_LIBCURL_DOESNT_SUPPORT;
  else if(strlen(nextarg) > 4 && strncasecompare("pn:", nextarg, 3)) {
    /* a public_name */
    err = getstr(&config->ech_public, nextarg, DENY_BLANK);
  }
  else if(strlen(nextarg) > 5 && strncasecompare("ecl:", nextarg, 4)) {
    /* an ECHConfigList */
    if('@' != *(nextarg + 4)) {
      err = getstr(&config->ech_config, nextarg, DENY_BLANK);
    }
    else {
      /* Indirect case: @filename or @- for stdin */
      char *tmpcfg = NULL;
      FILE *file;

      nextarg += 5;        /* skip over 'ecl:@' */
      if(!strcmp("-", nextarg)) {
        file = stdin;
      }
      else {
        file = fopen(nextarg, FOPEN_READTEXT);
      }
      if(!file) {
        warnf(global,
              "Couldn't read file \"%s\" "
              "specified for \"--ech ecl:\" option",
              nextarg);
        return PARAM_BAD_USE; /*  */
      }
      err = file2string(&tmpcfg, file);
      if(file != stdin)
        fclose(file);
      if(err)
        return err;
      config->ech_config = aprintf("ecl:%s",tmpcfg);
      free(tmpcfg);
      if(!config->ech_config)
        return PARAM_NO_MEM;
    } /* file done */
  }
  else {
    /* Simple case: just a string, with a keyword */
    err = getstr(&config->ech, nextarg, DENY_BLANK);
  }
  return err;
}